

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureBufferAtomicFunctions::iterate(TextureBufferAtomicFunctions *this)

{
  uint *value;
  uint *puVar1;
  ostringstream *this_00;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  MessageBuilder *this_01;
  char *description;
  uint *puVar7;
  qpTestResult testResult;
  TestContext *this_02;
  long lVar8;
  undefined1 local_1b0 [384];
  long lVar5;
  
  initTest(this);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x1680))(this->m_po_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xb5);
  (**(code **)(lVar5 + 0x80))(0,this->m_tbo_tex_id,0,0,0,0x88ba,0x8236);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error binding texture object to image unit 0!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xb8);
  (**(code **)(lVar5 + 0x528))(1,1,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error running compute shader!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xbb);
  (**(code **)(lVar5 + 0xdb8))(0x200);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error setting memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xbe);
  lVar6 = (**(code **)(lVar5 + 0xd00))
                    ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
                     (ulong)this->m_n_texels_in_texture_buffer << 2,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error mapping buffer object\'s data store to client address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0xc3);
  uVar2 = this->m_n_texels_in_texture_buffer;
  lVar8 = 1;
  puVar7 = (uint *)(lVar6 + -4);
  do {
    if ((ulong)uVar2 + lVar8 == 1) {
      (**(code **)(lVar5 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00d2e445;
    }
    value = puVar7 + 1;
    lVar8 = lVar8 + -1;
    puVar1 = puVar7 + 1;
    puVar7 = value;
  } while (*puVar1 == (uVar2 - 1) * uVar2 >> 1);
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Result is different than expected at index: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Expected value: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Result   value: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  (**(code **)(lVar5 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00d2e445:
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferAtomicFunctions::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get Gl entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	gl.bindImageTexture(0, m_tbo_tex_id, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit 0!");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

	gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

	/* Get result data */
	glw::GLuint* result = (glw::GLuint*)gl.mapBufferRange(
		m_glExtTokens.TEXTURE_BUFFER, 0, m_n_texels_in_texture_buffer * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client address space!");

	glw::GLuint expected_value = (m_n_texels_in_texture_buffer * (m_n_texels_in_texture_buffer - 1)) / 2;

	for (glw::GLuint i = 0; i < m_n_texels_in_texture_buffer; ++i)
	{
		/* Log error if expected data and result data are not equal */
		if (result[i] != expected_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected at index: " << i << "\n"
							   << "Expected value: " << expected_value << "\n"
							   << "Result   value: " << result[i] << "\n"
							   << tcu::TestLog::EndMessage;

			test_result = false;
			break;
		}
	}

	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);

	if (test_result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}